

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom32.cc
# Opt level: O0

int test_atom32(hwtest_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint32_t local_1838 [2];
  uint32_t src3 [512];
  uint32_t src2 [512];
  uint32_t src1 [512];
  int sz;
  int op;
  uint32_t xtra;
  uint32_t op2;
  uint32_t op1;
  int i;
  hwtest_ctx *ctx_local;
  
  op2 = 0;
  do {
    if (99999 < (int)op2) {
      return 1;
    }
    lVar5 = jrand48(ctx->rand48);
    xtra = (uint)lVar5 & 0xfff0000 | 0xd0000015;
    uVar6 = jrand48(ctx->rand48);
    uVar1 = (uint)uVar6;
    op = uVar1 & 0x3ffff03c | 0xc00007c0;
    lVar5 = jrand48(ctx->rand48);
    uVar2 = (uVar1 & 0x3c) >> 2;
    uVar3 = (uVar1 & 0xe00000) >> 0x15;
    if ((uVar6 & 0x20000000) == 0) {
      if (uVar2 != 2) goto LAB_0036ddaa;
    }
    else {
      xtra = xtra & 0xff80fe03 | 0x5001c;
      if (uVar2 == 2) {
        op = uVar1 & 0x3fe0303c | 0xc0c187c0;
      }
LAB_0036ddaa:
      if (((uVar3 != 4) && (uVar3 != 5)) && (uVar2 != 3)) {
        iVar4 = atom32_prep_grid(ctx,(uint32_t)lVar5);
        if (iVar4 != 0) {
          return 3;
        }
        iVar4 = atom32_prep_code(ctx,xtra,op);
        if (iVar4 != 0) {
          return 3;
        }
        atom32_gen(ctx,src2 + 0x1fe,src3 + 0x1fe,local_1838);
        iVar4 = atom32_test(ctx,xtra,op,src2 + 0x1fe,src3 + 0x1fe,local_1838,(uint32_t)lVar5);
        if (iVar4 != 0) {
          return 3;
        }
      }
    }
    op2 = op2 + 1;
  } while( true );
}

Assistant:

static int test_atom32(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000015 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc00007c0 | (jrand48(ctx->rand48) & 0x3ffff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		int sz = op2 >> 21 & 7;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x05001c;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
				/* and make sure b32 is used */
				op2 |= 0x00c00000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* bail if b64 or b128 selected */
		if (sz == 4 || sz == 5)
			continue;
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom32_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom32_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint32_t src1[0x200], src2[0x200], src3[0x200];
		atom32_gen(ctx, src1, src2, src3);
		if (atom32_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}